

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::Face(Map *this,Character *from,Direction direction)

{
  Character *other;
  bool bVar1;
  int num;
  reference ppCVar2;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  undefined1 local_50 [8];
  PacketBuilder builder;
  Direction direction_local;
  Character *from_local;
  Map *this_local;
  
  from->direction = direction;
  builder.add_size._7_1_ = direction;
  Character::CancelSpell(from);
  PacketBuilder::PacketBuilder((PacketBuilder *)local_50,PACKET_FACE,PACKET_PLAYER,3);
  num = Character::PlayerID(from);
  PacketBuilder::AddShort((PacketBuilder *)local_50,num);
  PacketBuilder::AddChar((PacketBuilder *)local_50,(uint)builder.add_size._7_1_);
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&character), bVar1) {
    ppCVar2 = std::_List_iterator<Character_*>::operator*(&__end1);
    other = *ppCVar2;
    if ((other != from) && (bVar1 = Character::InRange(from,other), bVar1)) {
      Character::Send(other,(PacketBuilder *)local_50);
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_50);
  return;
}

Assistant:

void Map::Face(Character *from, Direction direction)
{
	from->direction = direction;

	from->CancelSpell();

	PacketBuilder builder(PACKET_FACE, PACKET_PLAYER, 3);
	builder.AddShort(from->PlayerID());
	builder.AddChar(direction);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}
}